

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cpp
# Opt level: O0

THREAD_ID_TYPE * brynet::net::CurrentThread::tid(void)

{
  int *piVar1;
  long lVar2;
  undefined4 *puVar3;
  THREAD_ID_TYPE *pTVar4;
  
  piVar1 = (int *)__tls_get_addr(&PTR_001fdd28);
  if (*piVar1 == 0) {
    lVar2 = syscall(0xba);
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_001fdd28);
    *puVar3 = (int)lVar2;
  }
  pTVar4 = (THREAD_ID_TYPE *)__tls_get_addr(&PTR_001fdd28);
  return pTVar4;
}

Assistant:

brynet::net::CurrentThread::THREAD_ID_TYPE& brynet::net::CurrentThread::tid()
{
    if (cachedTid == 0)
    {
#ifdef PLATFORM_WINDOWS
        cachedTid = GetCurrentThreadId();
#else
        cachedTid = static_cast<pid_t>(::syscall(SYS_gettid));
#endif
    }

    return cachedTid;
}